

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_2::SingleSampleInterpolateAtSampleCase::init
          (SingleSampleInterpolateAtSampleCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  bool bVar1;
  ContextType ctxType;
  int iVar2;
  RenderTarget *pRVar3;
  NotSupportedError *this_01;
  EVP_PKEY_CTX *ctx_00;
  undefined1 local_190 [384];
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_MultisampleRenderCase).super_TestCase.m_context)->m_contextInfo,
                     "GL_OES_shader_multisample_interpolation");
  if (!bVar1) {
    ctxType.super_ApiType.m_bits =
         (ApiType)(*((this->super_MultisampleRenderCase).super_TestCase.m_context)->m_renderCtx->
                    _vptr_RenderContext[2])();
    bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
    if (!bVar1) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Test requires GL_OES_shader_multisample_interpolation extension",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderMultisampleInterpolationTests.cpp"
                 ,0x29c);
      goto LAB_00412403;
    }
  }
  if ((this->super_MultisampleRenderCase).m_renderTarget == TARGET_DEFAULT) {
    pRVar3 = Context::getRenderTarget((this->super_MultisampleRenderCase).super_TestCase.m_context);
    if (1 < pRVar3->m_numSamples) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Non-multisample framebuffer required",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderMultisampleInterpolationTests.cpp"
                 ,0x29e);
LAB_00412403:
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_190._0_8_ =
       ((this->super_MultisampleRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
       ->m_log;
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Verifying that using interpolateAtSample with multisample buffers not available returns sample evaluated at the center of the pixel.\n"
             ,0x85);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\tInterpolate varying containing screen space location.\n",0x37);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\t=> fract(screen space location) should be (about) (0.5, 0.5)\n",
             0x3e);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  ctx_00 = (EVP_PKEY_CTX *)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
  iVar2 = MultisampleShaderRenderUtil::MultisampleRenderCase::init
                    (&this->super_MultisampleRenderCase,ctx_00);
  return iVar2;
}

Assistant:

void SingleSampleInterpolateAtSampleCase::init (void)
{
	// requirements
	if (!m_context.getContextInfo().isExtensionSupported("GL_OES_shader_multisample_interpolation") && !glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
		TCU_THROW(NotSupportedError, "Test requires GL_OES_shader_multisample_interpolation extension");
	if (m_renderTarget == TARGET_DEFAULT && m_context.getRenderTarget().getNumSamples() > 1)
		TCU_THROW(NotSupportedError, "Non-multisample framebuffer required");

	// test purpose and expectations
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying that using interpolateAtSample with multisample buffers not available returns sample evaluated at the center of the pixel.\n"
		<< "	Interpolate varying containing screen space location.\n"
		<< "	=> fract(screen space location) should be (about) (0.5, 0.5)\n"
		<< tcu::TestLog::EndMessage;

	MultisampleShaderRenderUtil::MultisampleRenderCase::init();
}